

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bss_test.cc
# Opt level: O0

int test_describe_coupon_list(void)

{
  code *pcVar1;
  char *__s;
  BssDescribeCouponListRequestType *pBVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_1a1;
  int ret;
  HttpTestListener *local_180;
  HttpTestListener *listener;
  string local_170;
  allocator<char> local_149;
  string local_148 [39];
  allocator<char> local_121;
  string local_120 [55];
  allocator<char> local_e9;
  string local_e8 [32];
  BssDescribeCouponListRequestType *local_c8;
  Bss *bss;
  BssDescribeCouponListResponseType resp;
  BssDescribeCouponListRequestType req;
  
  aliyun::BssDescribeCouponListRequestType::BssDescribeCouponListRequestType
            ((BssDescribeCouponListRequestType *)
             &resp.coupons.
              super__Vector_base<aliyun::BssDescribeCouponListCouponType,_std::allocator<aliyun::BssDescribeCouponListCouponType>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  aliyun::BssDescribeCouponListResponseType::BssDescribeCouponListResponseType
            ((BssDescribeCouponListResponseType *)&bss);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e8,"cn-hangzhou",&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_120,"my_appid",&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_148,"my_secret",&local_149);
  pBVar2 = (BssDescribeCouponListRequestType *)
           aliyun::Bss::CreateBssClient(local_e8,local_120,local_148);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  local_c8 = pBVar2;
  if (pBVar2 == (BssDescribeCouponListRequestType *)0x0) {
    aliyun::BssDescribeCouponListResponseType::~BssDescribeCouponListResponseType
              ((BssDescribeCouponListResponseType *)&bss);
    aliyun::BssDescribeCouponListRequestType::~BssDescribeCouponListRequestType
              ((BssDescribeCouponListRequestType *)
               &resp.coupons.
                super__Vector_base<aliyun::BssDescribeCouponListCouponType,_std::allocator<aliyun::BssDescribeCouponListCouponType>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Bss::SetProxyHost((Bss *)pBVar2,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Bss::SetUseTls((Bss *)local_c8,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_describe_coupon_list_response;
  local_180 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_1a1);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_1a1);
  HttpTestListener::Start(local_180);
  std::__cxx11::string::operator=
            ((string *)
             &resp.coupons.
              super__Vector_base<aliyun::BssDescribeCouponListCouponType,_std::allocator<aliyun::BssDescribeCouponListCouponType>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"Status");
  std::__cxx11::string::operator=
            ((string *)(req.status.field_2._M_local_buf + 8),"StartDeliveryTime");
  std::__cxx11::string::operator=
            ((string *)(req.start_delivery_time.field_2._M_local_buf + 8),"EndDeliveryTime");
  std::__cxx11::string::operator=
            ((string *)(req.end_delivery_time.field_2._M_local_buf + 8),"PageSize");
  std::__cxx11::string::operator=((string *)(req.page_size.field_2._M_local_buf + 8),"PageNum");
  aliyun::Bss::DescribeCouponList
            (local_c8,(BssDescribeCouponListResponseType *)
                      &resp.coupons.
                       super__Vector_base<aliyun::BssDescribeCouponListCouponType,_std::allocator<aliyun::BssDescribeCouponListCouponType>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(BssErrorInfo *)&bss);
  HttpTestListener::WaitComplete(local_180);
  pHVar3 = local_180;
  if (local_180 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_180);
    operator_delete(pHVar3,0x180);
  }
  pBVar2 = local_c8;
  if (local_c8 != (BssDescribeCouponListRequestType *)0x0) {
    aliyun::Bss::~Bss((Bss *)local_c8);
    operator_delete(pBVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_describe_coupon_list() {
  BssDescribeCouponListRequestType req;
  BssDescribeCouponListResponseType resp;
  Bss* bss = Bss::CreateBssClient("cn-hangzhou", "my_appid", "my_secret");
  if(!bss) return 0;
  bss->SetProxyHost("127.0.0.1:12234");
  bss->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_describe_coupon_list_response);
  listener->Start();
  req.status = "Status";
  req.start_delivery_time = "StartDeliveryTime";
  req.end_delivery_time = "EndDeliveryTime";
  req.page_size = "PageSize";
  req.page_num = "PageNum";
  int ret = bss->DescribeCouponList(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete bss;
}